

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O3

void add_linear_comb_weighted<float,std::vector<double,std::allocator<double>>,long_double>
               (size_t *ix_arr,size_t st,size_t end,double *res,float *x,double *coef,double x_sd,
               double x_mean,double *fill_val,MissingAction missing_action,double *buffer_arr,
               size_t *buffer_NAs,bool first_run,vector<double,_std::allocator<double>_> *w)

{
  double dVar1;
  undefined1 auVar2 [16];
  pointer __first;
  pointer __last;
  size_t row;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  size_type __n;
  double *pdVar8;
  size_t row_1;
  longdouble lVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> sorted_ix;
  allocator_type local_d1;
  double *local_d0;
  longdouble local_c8;
  double local_b8;
  long local_b0;
  vector<double,_std::allocator<double>_> local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  pointer local_70;
  pointer local_68;
  size_t *local_60;
  float *local_58;
  double *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_b8 = x_mean;
  if (first_run) {
    local_50 = buffer_arr;
    *coef = *coef / x_sd;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (missing_action != Fail) {
      local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (unsigned_long *)0x0;
      std::vector<double,_std::allocator<double>_>::resize
                (&local_a8,(end - st) + 1,(value_type_conflict *)&local_88);
      local_c8 = (longdouble)0;
      local_d0 = coef;
      if (end < st) {
        __n = 0;
        lVar7 = 0;
      }
      else {
        local_68 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        local_c8 = (longdouble)0;
        local_70 = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        __n = 0;
        local_b0 = 0;
        sVar6 = st;
        pdVar8 = res;
        local_60 = ix_arr;
        local_58 = x;
        do {
          if ((uint)ABS(local_58[local_60[sVar6]]) < 0x7f800000) {
            local_40 = local_68[local_60[sVar6]];
            local_48 = (double)local_58[local_60[sVar6]];
            dVar10 = fma(local_48 - local_b8,*local_d0,*pdVar8);
            *pdVar8 = dVar10;
            local_70[__n] = local_40;
            local_50[__n] = local_48;
            __n = __n + 1;
            local_38 = local_40;
            local_c8 = local_c8 + (longdouble)local_40;
          }
          else {
            buffer_NAs[local_b0] = sVar6;
            local_b0 = local_b0 + 1;
          }
          sVar6 = sVar6 + 1;
          pdVar8 = pdVar8 + 1;
        } while (sVar6 <= end);
        local_c8 = local_c8 * (longdouble)0.5;
        lVar7 = local_b0;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_88,__n,&local_d1);
      __last = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      __first = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      auVar2 = _DAT_0036e1f0;
      if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar3 = ((long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start) - 8;
        auVar14._8_4_ = (int)uVar3;
        auVar14._0_8_ = uVar3;
        auVar14._12_4_ = (int)(uVar3 >> 0x20);
        auVar11._0_8_ = uVar3 >> 3;
        auVar11._8_8_ = auVar14._8_8_ >> 3;
        uVar5 = 0;
        auVar11 = auVar11 ^ _DAT_0036e1f0;
        auVar12 = _DAT_0036e1e0;
        do {
          auVar14 = auVar12 ^ auVar2;
          if ((bool)(~(auVar14._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar14._0_4_ ||
                      auVar11._4_4_ < auVar14._4_4_) & 1)) {
            local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5] = uVar5;
          }
          if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
              auVar14._12_4_ <= auVar11._12_4_) {
            local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5 + 1] = uVar5 + 1;
          }
          uVar5 = uVar5 + 2;
          lVar4 = auVar12._8_8_;
          auVar12._0_8_ = auVar12._0_8_ + 2;
          auVar12._8_8_ = lVar4 + 2;
        } while (((uVar3 >> 3) + 2 & 0xfffffffffffffffe) != uVar5);
        uVar3 = (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
        lVar4 = 0x3f;
        if (uVar3 != 0) {
          for (; uVar3 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<add_linear_comb_weighted<float,std::vector<double,std::allocator<double>>,long_double>(unsigned_long_const*,unsigned_long,unsigned_long,double*,float_const*,double&,double,double,double&,MissingAction,double*,unsigned_long*,bool,std::vector<double,std::allocator<double>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                   (ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_mult_hpp:627:19)>
                    )&buffer_arr);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<add_linear_comb_weighted<float,std::vector<double,std::allocator<double>>,long_double>(unsigned_long_const*,unsigned_long,unsigned_long,double*,float_const*,double&,double,double,double&,MissingAction,double*,unsigned_long*,bool,std::vector<double,std::allocator<double>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
                  ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )__first,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )__last,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_mult_hpp:627:19)>
                             )&buffer_arr);
      }
      dVar10 = buffer_arr
               [local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish[-1]];
      *fill_val = dVar10;
      if (__n != 0) {
        lVar9 = (longdouble)0;
        uVar3 = 0;
        do {
          lVar9 = lVar9 + (longdouble)
                          local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start
                          [local_88.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar3]];
          if (local_c8 <= lVar9) {
            dVar10 = buffer_arr
                     [local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar3]];
            if (((lVar9 == local_c8) && (!NAN(lVar9) && !NAN(local_c8))) && (uVar3 < __n - 1)) {
              dVar10 = dVar10 + (buffer_arr
                                 [local_88.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar3 + 1]] - dVar10) *
                                0.5;
            }
            *fill_val = dVar10;
            break;
          }
          uVar3 = uVar3 + 1;
        } while (__n != uVar3);
      }
      dVar10 = (dVar10 - local_b8) * *local_d0;
      *fill_val = dVar10;
      if ((lVar7 != 0) && ((dVar10 != 0.0 || (NAN(dVar10))))) {
        lVar4 = 0;
        do {
          res[buffer_NAs[lVar4] - st] = res[buffer_NAs[lVar4] - st] + dVar10;
          lVar4 = lVar4 + 1;
        } while (lVar7 != lVar4);
      }
      if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
        operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_00293bb0;
    }
  }
  else {
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (missing_action != Fail) {
      if (st <= end) {
        dVar10 = *coef;
        dVar1 = *fill_val;
        do {
          dVar13 = dVar1;
          if ((uint)ABS(x[ix_arr[st]]) < 0x7f800000) {
            dVar13 = ((double)x[ix_arr[st]] - x_mean) * dVar10;
          }
          *res = dVar13 + *res;
          st = st + 1;
          res = res + 1;
        } while (st <= end);
      }
      goto LAB_00293bb0;
    }
  }
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  if (st <= end) {
    local_c8 = (longdouble)CONCAT28(local_c8._8_2_,*coef);
    sVar6 = st;
    do {
      dVar10 = fma((double)x[ix_arr[sVar6]] - local_b8,local_c8._0_8_,res[sVar6 - st]);
      res[sVar6 - st] = dVar10;
      sVar6 = sVar6 + 1;
    } while (sVar6 <= end);
  }
LAB_00293bb0:
  if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void add_linear_comb_weighted(const size_t ix_arr[], size_t st, size_t end, double *restrict res,
                              const real_t_ *restrict x, double &coef, double x_sd, double x_mean, double &restrict fill_val,
                              MissingAction missing_action, double *restrict buffer_arr,
                              size_t *restrict buffer_NAs, bool first_run, mapping &restrict w)
{
    /* TODO: here don't need the buffer for NAs */

    if (first_run)
        coef /= x_sd;

    size_t cnt = 0;
    size_t cnt_NA = 0;
    double *restrict res_write = res - st;
    ldouble_safe cumw = 0;
    double w_this;
    /* TODO: these buffers should be allocated externally */
    std::vector<double> obs_weight;

    if (first_run && missing_action != Fail)
    {
        obs_weight.resize(end - st + 1, 0.);
    }

    if (missing_action == Fail)
    {    
        for (size_t row = st; row <= end; row++)
            res_write[row] = std::fma(x[ix_arr[row]] - x_mean, coef, res_write[row]);
    }

    else
    {
        if (first_run)
        {
            for (size_t row = st; row <= end; row++)
            {
                if (likely(!is_na_or_inf(x[ix_arr[row]])))
                {
                    w_this = w[ix_arr[row]];
                    res_write[row]     = std::fma(x[ix_arr[row]] - x_mean, coef, res_write[row]);
                    obs_weight[cnt]    = w_this;
                    buffer_arr[cnt++]  = x[ix_arr[row]];
                    cumw += w_this;
                }

                else
                {
                    buffer_NAs[cnt_NA++] = row;
                }

            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                res_write[row] += (is_na_or_inf(x[ix_arr[row]]))? fill_val : ( (x[ix_arr[row]]-x_mean) * coef );
            }
            return;
        }


        ldouble_safe mid_point = cumw / (ldouble_safe)2;
        std::vector<size_t> sorted_ix(cnt);
        std::iota(sorted_ix.begin(), sorted_ix.end(), (size_t)0);
        std::sort(sorted_ix.begin(), sorted_ix.end(),
                  [&buffer_arr](const size_t a, const size_t b){return buffer_arr[a] < buffer_arr[b];});
        ldouble_safe currw = 0;
        fill_val = buffer_arr[sorted_ix.back()]; /* <- will overwrite later */
        /* TODO: is this median calculation correct? should it do a weighted interpolation? */
        for (size_t ix = 0; ix < cnt; ix++)
        {
            currw += obs_weight[sorted_ix[ix]];
            if (currw >= mid_point)
            {
                if (currw == mid_point && ix < cnt-1)
                    fill_val = buffer_arr[sorted_ix[ix]] + (buffer_arr[sorted_ix[ix+1]] - buffer_arr[sorted_ix[ix]]) / 2.0;
                else
                    fill_val = buffer_arr[sorted_ix[ix]];
                break;
            }
        }

        fill_val = (fill_val - x_mean) * coef;
        if (cnt_NA && fill_val)
        {
            for (size_t row = 0; row < cnt_NA; row++)
                res_write[buffer_NAs[row]] += fill_val;
        }

    }
}